

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::update_piece_priorities
          (torrent *this,vector<download_priority_t,_file_index_t> *file_prios)

{
  bool bVar1;
  int iVar2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  element_type *peVar3;
  unsigned_long uVar4;
  file_storage *this_00;
  file_storage *this_01;
  __tuple_element_t<0UL,_tuple<strong_typedef<int,_piece_index_tag,_void>,_strong_typedef<int,_piece_index_tag,_void>_>_>
  *p_Var5;
  value_type *pvVar6;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *psVar7;
  value_type *local_128;
  value_type *local_118;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_bc;
  __tuple_element_t<1UL,_tuple<strong_typedef<int,_piece_index_tag,_void>,_strong_typedef<int,_piece_index_tag,_void>_>_>
  *p_Stack_b8;
  piece_index_t p;
  type *end;
  type *start;
  int local_9c;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_98;
  int local_94;
  strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> local_8d;
  int local_8c;
  download_priority_t file_prio;
  int64_t iStack_88;
  int64_t size;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_78;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> i;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_6c;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2;
  file_storage *fs;
  allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
  local_39;
  undefined1 local_38 [8];
  vector<download_priority_t,_piece_index_t> pieces;
  bool need_update;
  vector<download_priority_t,_file_index_t> *file_prios_local;
  torrent *this_local;
  
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_torrent_hot_members).m_torrent_file);
  iVar2 = torrent_info::num_pieces(peVar3);
  if (iVar2 != 0) {
    pieces.
    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    .
    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    iVar2 = torrent_info::num_pieces(peVar3);
    uVar4 = numeric_cast<unsigned_long,int,void>(iVar2);
    ::std::
    allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
    ::allocator(&local_39);
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
    ::container_wrapper((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                         *)local_38,uVar4,(value_type *)&dont_download,&local_39);
    ::std::
    allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>
    ::~allocator(&local_39);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_torrent_hot_members).m_torrent_file);
    this_00 = torrent_info::files(peVar3);
    ___end2 = file_storage::file_range(this_00);
    local_6c = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
               ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                        *)&__end2);
    rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
          ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                 *)&__end2);
    while( true ) {
      i = local_6c.m_idx.m_val;
      local_78 = rhs.m_idx.m_val;
      bVar1 = libtorrent::operator!=(local_6c,rhs);
      if (!bVar1) break;
      size._4_4_ = index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                   ::operator*(&local_6c);
      peVar3 = ::std::
               __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_torrent_hot_members).m_torrent_file);
      this_01 = torrent_info::files(peVar3);
      local_8c = size._4_4_;
      iStack_88 = file_storage::file_size(this_01,(file_index_t)size._4_4_);
      if (iStack_88 != 0) {
        local_94 = size._4_4_;
        bVar1 = file_storage::pad_file_at(this_00,(file_index_t)size._4_4_);
        if (bVar1) {
          local_118 = (value_type *)&dont_download;
        }
        else {
          local_98 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                     ::end_index(file_prios);
          bVar1 = strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                            ((strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                             ((long)&size + 4),&local_98);
          if (bVar1) {
            local_128 = (value_type *)&default_priority;
          }
          else {
            local_9c = size._4_4_;
            local_128 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                        ::operator[](file_prios,size._4_4_);
          }
          local_118 = local_128;
        }
        local_8d.m_val = local_118->m_val;
        bVar1 = strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>::operator==
                          (&local_8d,
                           (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *
                           )&dont_download);
        if (bVar1) {
          pieces.
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        }
        else {
          start._0_4_ = size._4_4_;
          file_piece_range_inclusive((aux *)((long)&start + 4),this_00,(file_index_t)size._4_4_);
          p_Var5 = ::std::
                   get<0ul,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                             ((tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                               *)((long)&start + 4));
          p_Stack_b8 = ::std::
                       get<1ul,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>
                                 ((tuple<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                                   *)((long)&start + 4));
          local_bc.m_val = p_Var5->m_val;
          while (bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                                   (&local_bc,p_Stack_b8), bVar1) {
            pvVar6 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                     ::operator[]((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                                   *)local_38,local_bc);
            psVar7 = ::std::
                     max<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>
                               (pvVar6,&local_8d);
            pvVar6 = container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                     ::operator[]((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                                   *)local_38,local_bc);
            pvVar6->m_val = psVar7->m_val;
            strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++(&local_bc);
          }
          pieces.
          super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          .
          super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        }
      }
      index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>::
      operator++(&local_6c);
    }
    if ((pieces.
         super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
         .
         super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
      prioritize_pieces(this,(vector<download_priority_t,_piece_index_t> *)local_38);
    }
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
    ::~container_wrapper
              ((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>_>
                *)local_38);
  }
  return;
}

Assistant:

void torrent::update_piece_priorities(
		aux::vector<download_priority_t, file_index_t> const& file_prios)
	{
		INVARIANT_CHECK;

		if (m_torrent_file->num_pieces() == 0) return;

		bool need_update = false;
		// initialize the piece priorities to 0, then only allow
		// setting higher priorities
		aux::vector<download_priority_t, piece_index_t> pieces(aux::numeric_cast<std::size_t>(
			m_torrent_file->num_pieces()), dont_download);
		file_storage const& fs = m_torrent_file->files();
		for (auto const i : fs.file_range())
		{
			std::int64_t const size = m_torrent_file->files().file_size(i);
			if (size == 0) continue;

			// pad files always have priority 0
			download_priority_t const file_prio
				= fs.pad_file_at(i) ? dont_download
				: i >= file_prios.end_index() ? default_priority
				: file_prios[i];

			if (file_prio == dont_download)
			{
				// the pieces already start out as priority 0, no need to update
				// the pieces vector in this case
				need_update = true;
				continue;
			}

			// mark all pieces of the file with this file's priority
			// but only if the priority is higher than the pieces
			// already set (to avoid problems with overlapping pieces)
			auto const [start, end] = file_piece_range_inclusive(fs, i);

			// if one piece spans several files, we might
			// come here several times with the same start_piece, end_piece
			for (piece_index_t p = start; p < end; ++p)
				pieces[p] = std::max(pieces[p], file_prio);

			need_update = true;
		}
		if (need_update) prioritize_pieces(pieces);
	}